

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

int __thiscall soplex::SPxDevexPR<double>::selectLeaveHyper(SPxDevexPR<double> *this,double feastol)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  SPxSolverBase<double> *pSVar5;
  pointer pdVar6;
  pointer pdVar7;
  int *piVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  pSVar5 = (this->super_SPxPricer<double>).thesolver;
  pdVar6 = (pSVar5->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (pSVar5->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = (ulong)(uint)(this->bestPrices).super_IdxSet.num;
  piVar8 = (this->bestPrices).super_IdxSet.idx;
  iVar11 = -1;
  dVar14 = 0.0;
  dVar1 = -1.0;
  do {
    dVar12 = dVar1;
    uVar10 = uVar9 & 0xffffffff;
    while( true ) {
      uVar9 = uVar9 - 1;
      if ((int)uVar10 < 1) {
        uVar9 = (ulong)(uint)(pSVar5->updateViols).super_IdxSet.num;
        goto LAB_001fe4ae;
      }
      iVar3 = piVar8[uVar9];
      dVar1 = pdVar6[iVar3];
      if (dVar1 < -feastol) break;
      iVar4 = (this->bestPrices).super_IdxSet.num;
      (this->bestPrices).super_IdxSet.num = iVar4 + -1;
      piVar8[uVar9] = piVar8[(long)iVar4 + -1];
      (pSVar5->isInfeasible).data[iVar3] = 0;
      uVar10 = (ulong)((int)uVar10 - 1);
    }
    dVar2 = pdVar7[iVar3];
    dVar13 = feastol;
    if (feastol <= dVar2) {
      dVar13 = dVar2;
    }
    dVar13 = (dVar1 * dVar1) / dVar13;
    if (dVar14 < dVar13) {
      this->last = dVar2;
      dVar14 = dVar13;
      iVar11 = iVar3;
    }
    dVar1 = dVar13;
    if ((0.0 <= dVar12) && (dVar1 = dVar12, dVar13 < dVar12)) {
      dVar1 = dVar13;
    }
  } while( true );
LAB_001fe4ae:
  pSVar5 = (this->super_SPxPricer<double>).thesolver;
  uVar10 = uVar9 & 0xffffffff;
  do {
    uVar9 = uVar9 - 1;
    if ((int)uVar10 < 1) {
      return iVar11;
    }
    piVar8 = (pSVar5->isInfeasible).data;
    iVar3 = (pSVar5->updateViols).super_IdxSet.idx[uVar9];
    if (piVar8[iVar3] == 1) {
      dVar1 = pdVar6[iVar3];
      dVar2 = pdVar7[iVar3];
      dVar13 = feastol;
      if (feastol <= dVar2) {
        dVar13 = dVar2;
      }
      dVar13 = (dVar1 * dVar1) / dVar13;
      if (dVar12 < dVar13) break;
    }
    uVar10 = (ulong)((int)uVar10 - 1);
  } while( true );
  if (dVar14 < dVar13) {
    this->last = dVar2;
    dVar14 = dVar13;
    iVar11 = iVar3;
  }
  piVar8[iVar3] = 2;
  DIdxSet::addIdx(&this->bestPrices,iVar3);
  goto LAB_001fe4ae;
}

Assistant:

int SPxDevexPR<R>::selectLeaveHyper(R feastol)
{
   R x;

   const R* fTest = this->thesolver->fTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   R best = 0;
   R leastBest = -1;
   int bstI = -1;
   int idx = -1;

   // find the best price from the short candidate list
   for(int i = bestPrices.size() - 1; i >= 0; --i)
   {
      idx = bestPrices.index(i);
      x = fTest[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, cpen[idx], feastol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            bstI = idx;
            last = cpen[idx];
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPrices.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indices for a better price
   for(int i = this->thesolver->updateViols.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViols.index(i);

      // only look at indeces that were not checked already
      if(this->thesolver->isInfeasible[idx] == this->VIOLATED)
      {
         x = fTest[idx];
         assert(x < -feastol);
         x = devexpr::computePrice(x, cpen[idx], feastol);

         if(x > leastBest)
         {
            if(x > best)
            {
               best = x;
               bstI = idx;
               last = cpen[idx];
            }

            // put index into candidate list
            this->thesolver->isInfeasible[idx] = this->VIOLATED_AND_CHECKED;
            bestPrices.addIdx(idx);
         }
      }
   }

   return bstI;
}